

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O2

void __thiscall
HMatrix::setup(HMatrix *this,int numCol_,int numRow_,int *Astart_,int *Aindex_,double *Avalue_,
              int *nonbasicFlag_)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  vector<int,_std::allocator<int>_> *this_00;
  int *piVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer piVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  size_type __new_size;
  ulong uVar14;
  vector<int,_std::allocator<int>_> AR_Bend;
  value_type local_5c;
  _Vector_base<int,_std::allocator<int>_> local_58;
  vector<int,_std::allocator<int>_> *local_40;
  vector<double,_std::allocator<double>_> *local_38;
  
  this->numCol = numCol_;
  this->numRow = numRow_;
  pvVar1 = &this->Astart;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)pvVar1,Astart_,Astart_ + (long)numCol_ + 1);
  __new_size = (size_type)(Astart_ + (long)numCol_ + 1)[-1];
  pvVar2 = &this->Aindex;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)pvVar2,Aindex_,Aindex_ + __new_size);
  local_38 = &this->Avalue;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)local_38,Avalue_,Avalue_ + __new_size);
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&this->ARstart,(long)this->numRow + 1);
  this_00 = &this->AR_Nend;
  local_5c = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(this_00,(long)this->numRow,&local_5c);
  local_5c = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            ((vector<int,_std::allocator<int>_> *)&local_58,(long)this->numRow,&local_5c);
  piVar5 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar11 = 0; lVar11 < this->numCol; lVar11 = lVar11 + 1) {
    lVar13 = (long)piVar5[lVar11];
    piVar6 = (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    if (nonbasicFlag_[lVar11] == 0) {
      for (; lVar13 < piVar5[lVar11 + 1]; lVar13 = lVar13 + 1) {
        local_58._M_impl.super__Vector_impl_data._M_start[piVar6[lVar13]] =
             local_58._M_impl.super__Vector_impl_data._M_start[piVar6[lVar13]] + 1;
      }
    }
    else {
      piVar7 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (; lVar13 < piVar5[lVar11 + 1]; lVar13 = lVar13 + 1) {
        piVar3 = piVar7 + piVar6[lVar13];
        *piVar3 = *piVar3 + 1;
      }
    }
  }
  piVar5 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar5 = 0;
  piVar6 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar12 = 0;
  for (lVar11 = 0; uVar14 = (ulong)this->numRow, lVar11 < (long)uVar14; lVar11 = lVar11 + 1) {
    iVar12 = iVar12 + piVar6[lVar11] + local_58._M_impl.super__Vector_impl_data._M_start[lVar11];
    piVar5[lVar11 + 1] = iVar12;
  }
  piVar6 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar11 = 0; lVar11 < (int)uVar14; lVar11 = lVar11 + 1) {
    local_58._M_impl.super__Vector_impl_data._M_start[lVar11] = piVar6[lVar11] + piVar5[lVar11];
    piVar6[lVar11] = piVar5[lVar11];
    uVar14 = (ulong)(uint)this->numRow;
  }
  local_40 = this_00;
  std::vector<int,_std::allocator<int>_>::resize(&this->ARindex,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&this->ARvalue,__new_size);
  piVar5 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar11 = 0; lVar11 < this->numCol; lVar11 = lVar11 + 1) {
    lVar13 = (long)piVar5[lVar11];
    piVar6 = (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    piVar7 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (nonbasicFlag_[lVar11] == 0) {
      for (; lVar13 < piVar5[lVar11 + 1]; lVar13 = lVar13 + 1) {
        iVar12 = piVar6[lVar13];
        iVar4 = local_58._M_impl.super__Vector_impl_data._M_start[iVar12];
        local_58._M_impl.super__Vector_impl_data._M_start[iVar12] = iVar4 + 1;
        piVar7[iVar4] = (int)lVar11;
        pdVar9[iVar4] = pdVar8[lVar13];
      }
    }
    else {
      piVar10 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      for (; lVar13 < piVar5[lVar11 + 1]; lVar13 = lVar13 + 1) {
        iVar12 = piVar6[lVar13];
        iVar4 = piVar10[iVar12];
        piVar10[iVar12] = iVar4 + 1;
        piVar7[iVar4] = (int)lVar11;
        pdVar9[iVar4] = pdVar8[lVar13];
      }
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void HMatrix::setup(int numCol_, int numRow_, const int *Astart_,
		    const int *Aindex_, const double *Avalue_, const int *nonbasicFlag_) {
  //Copy the A matrix and setup row-wise matrix with the nonbasic
  //columns before the basic columns for a general set of nonbasic
  //variables
  //
  //Copy A
  numCol = numCol_;
  numRow = numRow_;
  Astart.assign(Astart_, Astart_ + numCol_ + 1);
  
  int AcountX = Astart_[numCol_];
  Aindex.assign(Aindex_, Aindex_ + AcountX);
  Avalue.assign(Avalue_, Avalue_ + AcountX);

  // Build row copy - pointers
  vector<int> AR_Bend;
  ARstart.resize(numRow + 1);
  AR_Nend.assign(numRow, 0);
  AR_Bend.assign(numRow, 0);
  //Count the nonzeros of nonbasic and basic columns in each row
  for (int iCol = 0; iCol < numCol; iCol++) {
    if (nonbasicFlag_[iCol]) {
      for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
	int iRow = Aindex[k];
	AR_Nend[iRow]++;
      }
    } else {
      for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
	int iRow = Aindex[k];
	AR_Bend[iRow]++;
      }
    }
  }
  ARstart[0] = 0;
  for (int i = 0; i < numRow; i++)
    ARstart[i+1] = ARstart[i] + AR_Nend[i] + AR_Bend[i];
  for (int i = 0; i < numRow; i++) {
    AR_Bend[i] = ARstart[i] + AR_Nend[i];
    AR_Nend[i] = ARstart[i];
  }
  // Build row copy - elements
  ARindex.resize(AcountX);
  ARvalue.resize(AcountX);
  for (int iCol = 0; iCol < numCol; iCol++) {
    if (nonbasicFlag_[iCol]) {
      for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
	int iRow = Aindex[k];
	int iPut = AR_Nend[iRow]++;
	ARindex[iPut] = iCol;
	ARvalue[iPut] = Avalue[k];
      }
    } else {
      for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
	int iRow = Aindex[k];
	int iPut = AR_Bend[iRow]++;
	ARindex[iPut] = iCol;
	ARvalue[iPut] = Avalue[k];
      }
    }
  }
#ifdef JAJH_dev
  assert(setup_ok(nonbasicFlag_));
#endif
}